

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

void __thiscall cmCTestGIT::CommitParser::ParsePerson(CommitParser *this,char *str,Person *person)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *__nptr;
  char *pcVar6;
  char *local_30;
  
  cVar1 = *str;
  while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 != 0))) {
    cVar1 = str[1];
    str = str + 1;
  }
  for (lVar4 = 0; (str[lVar4] != '\0' && (str[lVar4] != '<')); lVar4 = lVar4 + 1) {
  }
  __nptr = str + lVar4;
  lVar5 = lVar4;
  local_30 = __nptr;
  do {
    if (lVar5 == 0) break;
    iVar2 = isspace((int)str[lVar5 + -1]);
    lVar5 = lVar5 + -1;
  } while (iVar2 != 0);
  std::__cxx11::string::_M_replace
            ((ulong)person,0,(char *)(person->Name)._M_string_length,(ulong)str);
  pcVar6 = __nptr;
  if (*__nptr != '\0') {
    __nptr = str + lVar4 + 1;
    pcVar6 = __nptr;
  }
  do {
    cVar1 = *__nptr;
    if (cVar1 == '\0') break;
    __nptr = __nptr + 1;
  } while (cVar1 != '>');
  local_30 = __nptr;
  std::__cxx11::string::_M_replace
            ((ulong)&person->EMail,0,(char *)(person->EMail)._M_string_length,(ulong)pcVar6);
  uVar3 = strtoul(__nptr,&local_30,10);
  person->Time = uVar3;
  lVar4 = strtol(local_30,&local_30,10);
  person->TimeZone = lVar4;
  return;
}

Assistant:

void ParsePerson(const char* str, Person& person)
  {
    // Person Name <person@domain.com> 1234567890 +0000
    const char* c = str;
    while (*c && isspace(*c)) {
      ++c;
    }

    const char* name_first = c;
    while (*c && *c != '<') {
      ++c;
    }
    const char* name_last = c;
    while (name_last != name_first && isspace(*(name_last - 1))) {
      --name_last;
    }
    person.Name.assign(name_first, name_last - name_first);

    const char* email_first = *c ? ++c : c;
    while (*c && *c != '>') {
      ++c;
    }
    const char* email_last = *c ? c++ : c;
    person.EMail.assign(email_first, email_last - email_first);

    person.Time = strtoul(c, const_cast<char**>(&c), 10);
    person.TimeZone = strtol(c, const_cast<char**>(&c), 10);
  }